

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_entry_from_file.c
# Opt level: O3

int archive_read_disk_entry_from_file(archive *_a,archive_entry *entry,int fd,stat *st)

{
  long offset;
  bool bVar1;
  int iVar2;
  uint uVar3;
  mode_t mVar4;
  int iVar5;
  wchar_t wVar6;
  char *pcVar7;
  la_int64_t lVar8;
  char *pcVar9;
  ulong uVar11;
  __off_t _Var12;
  __off_t __offset;
  ulong uVar13;
  int *piVar14;
  uint uVar15;
  size_t __size;
  uint *puVar16;
  long lVar17;
  stat s;
  int stflags;
  int local_10d8;
  int local_10d4;
  ulong local_10d0;
  stat local_10c8;
  long local_1038 [2];
  undefined4 local_1028;
  uint local_1024;
  undefined4 local_1020;
  uint local_ff0 [1008];
  ssize_t sVar10;
  
  local_10d8 = fd;
  archive_clear_error(_a);
  pcVar7 = archive_entry_sourcepath(entry);
  if (pcVar7 == (char *)0x0) {
    pcVar7 = archive_entry_pathname(entry);
  }
  if (*(long *)&_a[1].archive_format == 0) {
    if (st == (stat *)0x0) {
      if (fd < 0) {
        if (*(char *)((long)&_a[1].vtable + 1) == '\0') {
          st = &local_10c8;
          iVar2 = lstat(pcVar7,(stat *)st);
          if (iVar2 != 0) {
            piVar14 = __errno_location();
            iVar2 = *piVar14;
            pcVar9 = "Can\'t lstat %s";
            goto LAB_0046b013;
          }
        }
        else {
          st = &local_10c8;
          iVar2 = stat(pcVar7,(stat *)st);
          if (iVar2 != 0) {
            piVar14 = __errno_location();
            iVar2 = *piVar14;
            pcVar9 = "Can\'t stat %s";
LAB_0046b013:
            archive_set_error(_a,iVar2,pcVar9,pcVar7);
            return -0x19;
          }
        }
      }
      else {
        st = &local_10c8;
        iVar2 = fstat(fd,(stat *)st);
        if (iVar2 != 0) {
          piVar14 = __errno_location();
          iVar2 = *piVar14;
          pcVar7 = "Can\'t fstat";
          goto LAB_0046acd8;
        }
      }
    }
    archive_entry_copy_stat(entry,st);
  }
  lVar8 = archive_entry_uid(entry);
  pcVar9 = archive_read_disk_uname(_a,lVar8);
  if (pcVar9 != (char *)0x0) {
    archive_entry_copy_uname(entry,pcVar9);
  }
  lVar8 = archive_entry_gid(entry);
  pcVar9 = archive_read_disk_gname(_a,lVar8);
  if (pcVar9 != (char *)0x0) {
    archive_entry_copy_gname(entry,pcVar9);
  }
  if (((_a[1].file_count & 0x40) == 0) && ((st->st_mode & 0xf000) == 0x4000)) {
    if (local_10d8 < 0) {
      if (*(long *)&_a[1].archive_format == 0) {
        local_10d8 = open(pcVar7,0x80800);
      }
      else {
        local_10d8 = (*(code *)_a[1].archive_format_name)
                               (*(long *)&_a[1].archive_format,pcVar7,0x80800);
      }
      __archive_ensure_cloexec_flag(local_10d8);
      if (local_10d8 < 0) goto LAB_0046ac79;
    }
    iVar2 = ioctl(local_10d8,0x80086601,local_1038);
    if ((int)local_1038[0] != 0 && iVar2 == 0) {
      archive_entry_set_fflags(entry,(long)(int)local_1038[0],0);
    }
  }
LAB_0046ac79:
  if ((st->st_mode & 0xf000) == 0xa000) {
    __size = st->st_size + 1;
    pcVar9 = (char *)malloc(__size);
    if (pcVar9 == (char *)0x0) {
      pcVar7 = "Couldn\'t read link data";
      iVar2 = 0xc;
LAB_0046acd8:
      archive_set_error(_a,iVar2,pcVar7);
      return -0x19;
    }
    if (*(long *)&_a[1].archive_format == 0) {
      sVar10 = readlink(pcVar7,pcVar9,__size);
      uVar3 = (uint)sVar10;
    }
    else {
      iVar2 = (**(code **)&_a[1].compression_code)();
      sVar10 = readlinkat(iVar2,pcVar7,pcVar9,__size);
      uVar3 = (uint)sVar10;
    }
    if ((int)uVar3 < 0) {
      piVar14 = __errno_location();
      archive_set_error(_a,*piVar14,"Couldn\'t read link data");
      free(pcVar9);
      return -0x19;
    }
    pcVar9[uVar3 & 0x7fffffff] = '\0';
    archive_entry_set_symlink(entry,pcVar9);
    free(pcVar9);
  }
  mVar4 = archive_entry_filetype(entry);
  iVar2 = 0;
  if (((mVar4 != 0x8000) || (lVar8 = archive_entry_size(entry), iVar2 = 0, lVar8 < 1)) ||
     (pcVar7 = archive_entry_hardlink(entry), pcVar7 != (char *)0x0)) goto LAB_0046b0dd;
  local_10d4 = fd;
  if ((local_10d8 < 0) &&
     (pcVar7 = archive_read_disk_entry_setup_path((archive_read_disk *)_a,entry,&local_10d8),
     local_10d8 < 0)) {
    iVar2 = -0x19;
    fd = local_10d4;
    if (pcVar7 == (char *)0x0) goto LAB_0046b0dd;
    local_10d8 = open(pcVar7,0x80800);
    if (-1 < local_10d8) {
      __archive_ensure_cloexec_flag(local_10d8);
      uVar13 = 0;
      goto LAB_0046ad9c;
    }
LAB_0046b197:
    iVar2 = -0x19;
    piVar14 = __errno_location();
    archive_set_error(_a,*piVar14,"Can\'t open `%s\'",pcVar7);
    fd = local_10d4;
  }
  else {
    uVar11 = lseek(local_10d8,0,1);
    uVar13 = 0;
    if (uVar11 != 0) {
      lseek(local_10d8,0,0);
      uVar13 = uVar11;
    }
LAB_0046ad9c:
    _Var12 = lseek(local_10d8,0,4);
    if (-1 < _Var12) {
      if (_Var12 != 0) {
        lseek(local_10d8,0,0);
      }
      local_10d0 = uVar13;
      lVar8 = archive_entry_size(entry);
      if (lVar8 < 1) {
LAB_0046b07c:
        iVar2 = 0;
      }
      else {
        _Var12 = 0;
        while (__offset = lseek(local_10d8,_Var12,3), __offset != -1) {
          _Var12 = lseek(local_10d8,__offset,4);
          if (_Var12 == -1) {
            piVar14 = __errno_location();
            iVar2 = *piVar14;
            if (iVar2 == 6) {
              _Var12 = lseek(local_10d8,0,2);
              iVar2 = 0;
              if (_Var12 != -1) goto LAB_0046b0ca;
              iVar2 = *piVar14;
            }
            pcVar7 = "lseek(SEEK_DATA) failed";
            goto LAB_0046b0ba;
          }
          iVar2 = 0;
          if ((_Var12 == lVar8 && __offset == 0) ||
             (archive_entry_sparse_add_entry(entry,__offset,_Var12 - __offset), iVar2 = 0,
             lVar8 <= _Var12)) goto LAB_0046b0ca;
        }
        piVar14 = __errno_location();
        iVar2 = *piVar14;
        if (iVar2 == 6) {
          wVar6 = archive_entry_sparse_count(entry);
          if (wVar6 != L'\0') goto LAB_0046b07c;
          _Var12 = lseek(local_10d8,0,4);
          iVar2 = 0;
          if (_Var12 == 0) {
            _Var12 = lseek(local_10d8,0,2);
            iVar2 = 0;
            if (_Var12 == lVar8) {
              archive_entry_sparse_add_entry(entry,0,0);
              iVar2 = 0;
            }
          }
        }
        else {
          pcVar7 = "lseek(SEEK_HOLE) failed";
LAB_0046b0ba:
          archive_set_error(_a,iVar2,pcVar7);
          iVar2 = -0x19;
        }
      }
LAB_0046b0ca:
      lseek(local_10d8,local_10d0,0);
      fd = local_10d4;
      goto LAB_0046b0dd;
    }
    mVar4 = archive_entry_filetype(entry);
    fd = local_10d4;
    iVar2 = 0;
    if (((mVar4 != 0x8000) ||
        (lVar8 = archive_entry_size(entry), fd = local_10d4, iVar2 = 0, lVar8 < 1)) ||
       (pcVar7 = archive_entry_hardlink(entry), fd = local_10d4, pcVar7 != (char *)0x0))
    goto LAB_0046b0dd;
    if (local_10d8 < 0) {
      pcVar7 = archive_read_disk_entry_setup_path((archive_read_disk *)_a,entry,(int *)0x0);
      iVar2 = -0x19;
      fd = local_10d4;
      if (pcVar7 == (char *)0x0) goto LAB_0046b0dd;
      if (*(long *)&_a[1].archive_format == 0) {
        local_10d8 = open(pcVar7,0x80800);
      }
      else {
        local_10d8 = (*(code *)_a[1].archive_format_name)
                               (*(long *)&_a[1].archive_format,pcVar7,0x80800);
      }
      if (local_10d8 < 0) goto LAB_0046b197;
      __archive_ensure_cloexec_flag(local_10d8);
    }
    iVar2 = 0;
    memset(local_1038,0,0x1000);
    local_1038[1] = 0xffffffffffffffff;
    local_1028 = 1;
    local_1020 = 0x48;
    uVar13 = archive_entry_size(entry);
    iVar5 = ioctl(local_10d8,0xc020660b,local_1038);
    fd = local_10d4;
    if (-1 < iVar5) {
      local_10d0 = local_10d0 & 0xffffffff00000000;
      do {
        if (local_1024 == 0) {
          if ((int)local_10d0 == 0) {
            iVar2 = 0;
            archive_entry_sparse_add_entry(entry,0,0);
            fd = local_10d4;
          }
          else {
LAB_0046b1be:
            iVar2 = 0;
            fd = local_10d4;
          }
          break;
        }
        uVar3 = local_1024;
        if (0 < (int)local_1024) {
          bVar1 = true;
          iVar5 = 0;
          puVar16 = local_ff0;
          do {
            uVar15 = *puVar16;
            if ((uVar15 >> 0xb & 1) == 0) {
              offset = *(long *)(puVar16 + -10);
              uVar11 = offset + *(long *)(puVar16 + -6);
              iVar2 = 0;
              lVar17 = 0;
              if (uVar13 <= uVar11) {
                lVar17 = uVar11 - uVar13;
              }
              uVar11 = *(long *)(puVar16 + -6) - lVar17;
              fd = local_10d4;
              if (uVar11 == uVar13 && offset == 0) goto LAB_0046b0dd;
              if (0 < (long)uVar11) {
                archive_entry_sparse_add_entry(entry,offset,uVar11);
                uVar15 = *puVar16;
                uVar3 = local_1024;
              }
            }
            if ((uVar15 & 1) != 0) {
              bVar1 = false;
            }
            iVar5 = iVar5 + 1;
            puVar16 = puVar16 + 0xe;
          } while (iVar5 < (int)uVar3);
          if (!bVar1) goto LAB_0046b1be;
        }
        local_1038[0] =
             local_1038[(ulong)uVar3 * 7 + -1] + local_10c8.__glibc_reserved[(ulong)uVar3 * 7];
        local_10d0 = CONCAT44(local_10d0._4_4_,(int)local_10d0 + 1);
        iVar2 = 0;
        iVar5 = ioctl(local_10d8,0xc020660b,local_1038);
        fd = local_10d4;
      } while (-1 < iVar5);
    }
  }
LAB_0046b0dd:
  if (local_10d8 != fd) {
    close(local_10d8);
  }
  return iVar2;
}

Assistant:

int
archive_read_disk_entry_from_file(struct archive *_a,
    struct archive_entry *entry,
    int fd,
    const struct stat *st)
{
	struct archive_read_disk *a = (struct archive_read_disk *)_a;
	const char *path, *name;
	struct stat s;
	int initial_fd = fd;
	int r, r1;

	archive_clear_error(_a);
	path = archive_entry_sourcepath(entry);
	if (path == NULL)
		path = archive_entry_pathname(entry);

	if (a->tree == NULL) {
		if (st == NULL) {
#if HAVE_FSTAT
			if (fd >= 0) {
				if (fstat(fd, &s) != 0) {
					archive_set_error(&a->archive, errno,
					    "Can't fstat");
					return (ARCHIVE_FAILED);
				}
			} else
#endif
#if HAVE_LSTAT
			if (!a->follow_symlinks) {
				if (lstat(path, &s) != 0) {
					archive_set_error(&a->archive, errno,
					    "Can't lstat %s", path);
					return (ARCHIVE_FAILED);
				}
			} else
#endif
			if (stat(path, &s) != 0) {
				archive_set_error(&a->archive, errno,
				    "Can't stat %s", path);
				return (ARCHIVE_FAILED);
			}
			st = &s;
		}
		archive_entry_copy_stat(entry, st);
	}

	/* Lookup uname/gname */
	name = archive_read_disk_uname(_a, archive_entry_uid(entry));
	if (name != NULL)
		archive_entry_copy_uname(entry, name);
	name = archive_read_disk_gname(_a, archive_entry_gid(entry));
	if (name != NULL)
		archive_entry_copy_gname(entry, name);

#ifdef HAVE_STRUCT_STAT_ST_FLAGS
	/* On FreeBSD, we get flags for free with the stat. */
	/* TODO: Does this belong in copy_stat()? */
	if ((a->flags & ARCHIVE_READDISK_NO_FFLAGS) == 0 && st->st_flags != 0)
		archive_entry_set_fflags(entry, st->st_flags, 0);
#endif

#if (defined(FS_IOC_GETFLAGS) && defined(HAVE_WORKING_FS_IOC_GETFLAGS)) || \
    (defined(EXT2_IOC_GETFLAGS) && defined(HAVE_WORKING_EXT2_IOC_GETFLAGS))
	/* Linux requires an extra ioctl to pull the flags.  Although
	 * this is an extra step, it has a nice side-effect: We get an
	 * open file descriptor which we can use in the subsequent lookups. */
	if ((a->flags & ARCHIVE_READDISK_NO_FFLAGS) == 0 &&
	    (S_ISREG(st->st_mode) || S_ISDIR(st->st_mode))) {
		if (fd < 0) {
			if (a->tree != NULL)
				fd = a->open_on_current_dir(a->tree, path,
					O_RDONLY | O_NONBLOCK | O_CLOEXEC);
			else
				fd = open(path, O_RDONLY | O_NONBLOCK |
						O_CLOEXEC);
			__archive_ensure_cloexec_flag(fd);
		}
		if (fd >= 0) {
			int stflags;
			r = ioctl(fd,
#if defined(FS_IOC_GETFLAGS)
			    FS_IOC_GETFLAGS,
#else
			    EXT2_IOC_GETFLAGS,
#endif
			    &stflags);
			if (r == 0 && stflags != 0)
				archive_entry_set_fflags(entry, stflags, 0);
		}
	}
#endif

#if defined(HAVE_READLINK) || defined(HAVE_READLINKAT)
	if (S_ISLNK(st->st_mode)) {
		size_t linkbuffer_len = st->st_size + 1;
		char *linkbuffer;
		int lnklen;

		linkbuffer = malloc(linkbuffer_len);
		if (linkbuffer == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "Couldn't read link data");
			return (ARCHIVE_FAILED);
		}
		if (a->tree != NULL) {
#ifdef HAVE_READLINKAT
			lnklen = readlinkat(a->tree_current_dir_fd(a->tree),
			    path, linkbuffer, linkbuffer_len);
#else
			if (a->tree_enter_working_dir(a->tree) != 0) {
				archive_set_error(&a->archive, errno,
				    "Couldn't read link data");
				free(linkbuffer);
				return (ARCHIVE_FAILED);
			}
			lnklen = readlink(path, linkbuffer, linkbuffer_len);
#endif /* HAVE_READLINKAT */
		} else
			lnklen = readlink(path, linkbuffer, linkbuffer_len);
		if (lnklen < 0) {
			archive_set_error(&a->archive, errno,
			    "Couldn't read link data");
			free(linkbuffer);
			return (ARCHIVE_FAILED);
		}
		linkbuffer[lnklen] = 0;
		archive_entry_set_symlink(entry, linkbuffer);
		free(linkbuffer);
	}
#endif /* HAVE_READLINK || HAVE_READLINKAT */

	r = 0;
	if ((a->flags & ARCHIVE_READDISK_NO_ACL) == 0)
		r = archive_read_disk_entry_setup_acls(a, entry, &fd);
	if ((a->flags & ARCHIVE_READDISK_NO_XATTR) == 0) {
		r1 = setup_xattrs(a, entry, &fd);
		if (r1 < r)
			r = r1;
	}
	if (a->flags & ARCHIVE_READDISK_MAC_COPYFILE) {
		r1 = setup_mac_metadata(a, entry, &fd);
		if (r1 < r)
			r = r1;
	}
	r1 = setup_sparse(a, entry, &fd);
	if (r1 < r)
		r = r1;

	/* If we opened the file earlier in this function, close it. */
	if (initial_fd != fd)
		close(fd);
	return (r);
}